

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_lua_generator.cc
# Opt level: O2

void __thiscall
t_lua_generator::generate_deserialize_field
          (t_lua_generator *this,ostream *out,t_field *tfield,bool local,string *prefix)

{
  pointer pcVar1;
  int iVar2;
  t_struct *tstruct;
  ostream *poVar3;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  char *pcVar5;
  string *this_00;
  t_base_type *this_01;
  undefined1 auVar6 [12];
  string name;
  string local_90;
  string local_70;
  string local_50;
  
  tstruct = (t_struct *)t_type::get_true_type(tfield->type_);
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[4])(tstruct);
  if ((char)iVar2 != '\0') {
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x20);
    std::operator+(&name,"CANNOT GENERATE DESERIALIZE CODE FOR void TYPE: ",prefix);
    std::operator+(pbVar4,&name,&tfield->name_);
    __cxa_throw(pbVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  std::operator+(&name,prefix,&tfield->name_);
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xb])(tstruct);
  if (((char)iVar2 == '\0') &&
     (iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xc])(tstruct), (char)iVar2 == '\0')
     ) {
    iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xd])(tstruct);
    if ((char)iVar2 == '\0') {
      iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[5])(tstruct);
      if (((char)iVar2 == '\0') &&
         (iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[10])(tstruct),
         (char)iVar2 == '\0')) {
        pcVar1 = (tfield->name_)._M_dataplus._M_p;
        iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
        printf("DO NOT KNOW HOW TO DESERIALIZE FIELD \'%s\' TYPE \'%s\'\n",pcVar1,
               *(undefined8 *)CONCAT44(extraout_var,iVar2));
      }
      else {
        poVar3 = t_generator::indent((t_generator *)this,out);
        pcVar5 = "";
        if (local) {
          pcVar5 = "local ";
        }
        poVar3 = std::operator<<(poVar3,pcVar5);
        poVar3 = std::operator<<(poVar3,(string *)&name);
        std::operator<<(poVar3," = iprot:");
        iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[5])(tstruct);
        if ((char)iVar2 == '\0') {
          iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[10])(tstruct);
          if ((char)iVar2 != '\0') {
            std::operator<<(out,"readI32()");
          }
        }
        else {
          this_01 = (t_base_type *)
                    (ulong)*(uint *)&(tstruct->members_).
                                     super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                                     _M_impl.super__Vector_impl_data._M_start;
          switch(this_01) {
          case (t_base_type *)0x0:
            pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __cxa_allocate_exception(0x20);
            std::operator+(pbVar4,"compiler error: cannot serialize void field in a struct: ",&name)
            ;
            __cxa_throw(pbVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          case (t_base_type *)0x1:
            pcVar5 = "readString()";
            break;
          case (t_base_type *)0x2:
            pcVar5 = "readBool()";
            break;
          case (t_base_type *)0x3:
            pcVar5 = "readByte()";
            break;
          case (t_base_type *)0x4:
            pcVar5 = "readI16()";
            break;
          case (t_base_type *)0x5:
            pcVar5 = "readI32()";
            break;
          case (t_base_type *)0x6:
            pcVar5 = "readI64()";
            break;
          case (t_base_type *)0x7:
            pcVar5 = "readDouble()";
            break;
          default:
            auVar6 = __cxa_allocate_exception(0x20);
            t_base_type::t_base_name_abi_cxx11_(&local_50,this_01,auVar6._8_4_);
            std::operator+(auVar6._0_8_,"compiler error: no PHP name for base type ",&local_50);
            __cxa_throw(auVar6._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          std::operator<<(out,pcVar5);
        }
        std::operator<<(out,(string *)&::endl_abi_cxx11_);
      }
      goto LAB_0023d008;
    }
    std::__cxx11::string::string((string *)&local_90,(string *)&name);
    generate_deserialize_container(this,out,(t_type *)tstruct,local,&local_90);
    this_00 = &local_90;
  }
  else {
    std::__cxx11::string::string((string *)&local_70,(string *)&name);
    generate_deserialize_struct(this,out,tstruct,local,&local_70);
    this_00 = &local_70;
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_0023d008:
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void t_lua_generator::generate_deserialize_field(ostream& out,
                                                 t_field* tfield,
                                                 bool local,
                                                 string prefix) {
  t_type* type = get_true_type(tfield->get_type());

  if (type->is_void()) {
    throw "CANNOT GENERATE DESERIALIZE CODE FOR void TYPE: " + prefix + tfield->get_name();
  }

  string name = prefix + tfield->get_name();

  if (type->is_struct() || type->is_xception()) {
    generate_deserialize_struct(out, (t_struct*)type, local, name);
  } else if (type->is_container()) {
    generate_deserialize_container(out, type, local, name);
  } else if (type->is_base_type() || type->is_enum()) {
    indent(out) << (local ? "local " : "") << name << " = iprot:";

    if (type->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
        throw "compiler error: cannot serialize void field in a struct: " + name;
        break;
      case t_base_type::TYPE_STRING:
        out << "readString()";
        break;
      case t_base_type::TYPE_BOOL:
        out << "readBool()";
        break;
      case t_base_type::TYPE_I8:
        out << "readByte()";
        break;
      case t_base_type::TYPE_I16:
        out << "readI16()";
        break;
      case t_base_type::TYPE_I32:
        out << "readI32()";
        break;
      case t_base_type::TYPE_I64:
        out << "readI64()";
        break;
      case t_base_type::TYPE_DOUBLE:
        out << "readDouble()";
        break;
      default:
        throw "compiler error: no PHP name for base type " + t_base_type::t_base_name(tbase);
      }
    } else if (type->is_enum()) {
      out << "readI32()";
    }
    out << endl;

  } else {
    printf("DO NOT KNOW HOW TO DESERIALIZE FIELD '%s' TYPE '%s'\n",
           tfield->get_name().c_str(),
           type->get_name().c_str());
  }
}